

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

void __thiscall QDockAreaLayoutInfo::add(QDockAreaLayoutInfo *this,QWidget *widget)

{
  bool bVar1;
  QDockWidget *pQVar2;
  QDockAreaLayoutItem *this_00;
  QDockWidgetGroupWindow *pQVar3;
  QLayoutItem *_widgetItem;
  long in_FS_OFFSET;
  QDockWidgetGroupWindow *groupWindow;
  QDockWidget *dockWidget;
  QDockWidgetGroupWindow *in_stack_ffffffffffffff18;
  QList<QDockAreaLayoutItem> *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  QDockAreaLayoutItem *in_stack_ffffffffffffff30;
  QWidget *in_stack_ffffffffffffff50;
  QDockAreaLayoutInfo *in_stack_ffffffffffffff58;
  char local_90 [56];
  QDockAreaLayoutItem local_58;
  QDockAreaLayoutItem local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  indexOf(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  bVar1 = QList<int>::isEmpty((QList<int> *)0x574979);
  QList<int>::~QList((QList<int> *)0x574989);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    pQVar2 = qobject_cast<QDockWidget*>((QObject *)0x5749a2);
    if (pQVar2 == (QDockWidget *)0x0) {
      pQVar3 = qobject_cast<QDockWidgetGroupWindow*>((QObject *)0x574a19);
      if (pQVar3 == (QDockWidgetGroupWindow *)0x0) {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                   (int)((ulong)in_stack_ffffffffffffff20 >> 0x20),(char *)in_stack_ffffffffffffff18
                  );
        QMessageLogger::fatal
                  (local_90,"Coding error. Add supports only QDockWidget and QDockWidgetGroupWindow"
                  );
      }
      else {
        _widgetItem = (QLayoutItem *)operator_new(0x18);
        QDockWidgetGroupWindowItem::QDockWidgetGroupWindowItem
                  ((QDockWidgetGroupWindowItem *)_widgetItem,in_stack_ffffffffffffff18);
        QDockAreaLayoutItem::QDockAreaLayoutItem(&local_58,_widgetItem);
        QList<QDockAreaLayoutItem>::append
                  ((QList<QDockAreaLayoutItem> *)_widgetItem,(rvalue_ref)in_stack_ffffffffffffff18);
        QDockAreaLayoutItem::~QDockAreaLayoutItem(in_stack_ffffffffffffff30);
      }
    }
    else {
      this_00 = (QDockAreaLayoutItem *)operator_new(0x18);
      QDockWidgetItem::QDockWidgetItem
                ((QDockWidgetItem *)in_stack_ffffffffffffff20,
                 (QDockWidget *)in_stack_ffffffffffffff18);
      QDockAreaLayoutItem::QDockAreaLayoutItem(&local_30,(QLayoutItem *)this_00);
      QList<QDockAreaLayoutItem>::append
                (in_stack_ffffffffffffff20,(rvalue_ref)in_stack_ffffffffffffff18);
      QDockAreaLayoutItem::~QDockAreaLayoutItem(this_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDockAreaLayoutInfo::add(QWidget *widget)
{
    // Do not add twice
    if (!indexOf(widget).isEmpty())
        return;

    if (auto *dockWidget = qobject_cast<QDockWidget *>(widget)) {
        item_list.append(QDockAreaLayoutItem(new QDockWidgetItem(dockWidget)));
        return;
    }

    if (auto *groupWindow = qobject_cast<QDockWidgetGroupWindow *>(widget)) {
        item_list.append(QDockAreaLayoutItem(new QDockWidgetGroupWindowItem(groupWindow)));
        return;
    }

    qFatal("Coding error. Add supports only QDockWidget and QDockWidgetGroupWindow");
}